

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O0

MPP_RET parser_one_nalu(H264_SLICE_t *currSlice)

{
  MPP_RET MVar1;
  MPP_RET local_1c;
  MPP_RET ret;
  H264_SLICE_t *currSlice_local;
  
  local_1c = parser_nalu_header(currSlice);
  if (local_1c < MPP_OK) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0xe5);
    }
LAB_001bbdef:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","parser_one_nalu error.",(char *)0x0);
    }
    currSlice->p_Dec->nalu_ret = ReadNaluError;
    return local_1c;
  }
  if ((currSlice->p_Vid->deny_flag != 0) &&
     ((currSlice->p_Cur->nalu).nalu_type != H264_NALU_TYPE_SPS)) {
    currSlice->p_Dec->nalu_ret = NaluNotSupport;
    return MPP_OK;
  }
  if ((((currSlice->mvcExt).view_id != 0) && ((currSlice->mvcExt).valid != 0)) &&
     ((currSlice->p_Dec->cfg->base).enable_mvc == 0)) {
    currSlice->p_Dec->nalu_ret = MvcDisAble;
    return MPP_OK;
  }
  switch((currSlice->p_Cur->nalu).nalu_type) {
  case H264_NALU_TYPE_SLICE:
  case H264_NALU_TYPE_IDR:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","nalu_type=SLICE.",(char *)0x0);
    }
    local_1c = process_slice(currSlice);
    if (local_1c < MPP_OK) {
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0xf8);
      }
      goto LAB_001bbdef;
    }
    currSlice->p_Dec->nalu_ret = StartOfPicture;
    break;
  case H264_NALU_TYPE_DPA:
  case H264_NALU_TYPE_DPB:
  case H264_NALU_TYPE_DPC:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_DPA DPB DPC, and not supported.",(char *)0x0)
      ;
    }
    currSlice->p_Dec->nalu_ret = NaluNotSupport;
    break;
  case H264_NALU_TYPE_SEI:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","nalu_type=SEI",(char *)0x0);
    }
    process_sei(currSlice);
    currSlice->p_Dec->nalu_ret = NALU_SEI;
    break;
  case H264_NALU_TYPE_SPS:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","nalu_type=SPS",(char *)0x0);
    }
    local_1c = process_sps(currSlice);
    if (local_1c < MPP_OK) {
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0xfd);
      }
      goto LAB_001bbdef;
    }
    currSlice->p_Dec->nalu_ret = NALU_SPS;
    currSlice->p_Vid->deny_flag = 0;
    break;
  case H264_NALU_TYPE_PPS:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","nalu_type=PPS",(char *)0x0);
    }
    MVar1 = process_pps(currSlice);
    if ((MVar1 < MPP_OK) && ((h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x104);
    }
    currSlice->p_Dec->nalu_ret = NALU_PPS;
    break;
  case H264_NALU_TYPE_AUD:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_AUD.",(char *)0x0);
    }
    currSlice->p_Dec->nalu_ret = SkipNALU;
    break;
  case H264_NALU_TYPE_EOSEQ:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_EOSEQ.",(char *)0x0);
    }
    currSlice->p_Dec->nalu_ret = SkipNALU;
    break;
  case H264_NALU_TYPE_EOSTREAM:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_EOSTREAM.",(char *)0x0);
    }
    currSlice->p_Dec->nalu_ret = SkipNALU;
    break;
  case H264_NALU_TYPE_FILL:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_FILL.",(char *)0x0);
    }
    currSlice->p_Dec->nalu_ret = SkipNALU;
    break;
  default:
    currSlice->p_Dec->nalu_ret = SkipNALU;
    break;
  case H264_NALU_TYPE_PREFIX:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_PREFIX.",(char *)0x0);
    }
    process_prefix(currSlice);
    break;
  case H264_NALU_TYPE_SUB_SPS:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","nalu_type=SUB_SPS",(char *)0x0);
    }
    MVar1 = process_subsps(currSlice);
    if ((MVar1 < MPP_OK) && ((h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x10a);
    }
    currSlice->p_Dec->nalu_ret = NALU_SubSPS;
    break;
  case H264_NALU_TYPE_SLC_EXT:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_SLC_EXT.",(char *)0x0);
    }
    currSlice->p_Dec->nalu_ret = SkipNALU;
    break;
  case H264_NALU_TYPE_VDRD:
    if ((h264d_debug & 0x80) != 0) {
      _mpp_log_l(4,"h264d_parse","Found H264_NALU_TYPE_VDRD.",(char *)0x0);
    }
    currSlice->p_Dec->nalu_ret = SkipNALU;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET parser_one_nalu(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    FUN_CHECK(ret = parser_nalu_header(currSlice));

    if (currSlice->p_Vid->deny_flag &&
        currSlice->p_Cur->nalu.nalu_type != H264_NALU_TYPE_SPS) {
        currSlice->p_Dec->nalu_ret = NaluNotSupport;
        return MPP_OK;
    }
    //!< check whether supprot mvc
    if (currSlice->mvcExt.view_id && currSlice->mvcExt.valid &&
        !currSlice->p_Dec->cfg->base.enable_mvc) {
        currSlice->p_Dec->nalu_ret = MvcDisAble;
        return MPP_OK;
    }

    //!< nalu_parse
    switch (currSlice->p_Cur->nalu.nalu_type) {
    case H264_NALU_TYPE_SLICE:
    case H264_NALU_TYPE_IDR:
        H264D_DBG(H264D_DBG_PARSE_NALU, "nalu_type=SLICE.");
        FUN_CHECK(ret = process_slice(currSlice));
        currSlice->p_Dec->nalu_ret = StartOfPicture;
        break;
    case H264_NALU_TYPE_SPS:
        H264D_DBG(H264D_DBG_PARSE_NALU, "nalu_type=SPS");
        FUN_CHECK(ret = process_sps(currSlice));
        currSlice->p_Dec->nalu_ret = NALU_SPS;
        currSlice->p_Vid->deny_flag = 0;
        break;
    case H264_NALU_TYPE_PPS:
        H264D_DBG(H264D_DBG_PARSE_NALU, "nalu_type=PPS");
        if (process_pps(currSlice) < 0)
            H264D_WARNNING("Function error(%d).\n", __LINE__);
        currSlice->p_Dec->nalu_ret = NALU_PPS;
        break;
    case H264_NALU_TYPE_SUB_SPS:
        H264D_DBG(H264D_DBG_PARSE_NALU, "nalu_type=SUB_SPS");
        if (process_subsps(currSlice) < 0)
            H264D_WARNNING("Function error(%d).\n", __LINE__);
        currSlice->p_Dec->nalu_ret = NALU_SubSPS;
        break;
    case H264_NALU_TYPE_SEI:
        H264D_DBG(H264D_DBG_PARSE_NALU, "nalu_type=SEI");
        ret = process_sei(currSlice);
        currSlice->p_Dec->nalu_ret = NALU_SEI;
        break;
    case H264_NALU_TYPE_SLC_EXT:
        H264D_DBG(H264D_DBG_PARSE_NALU, "Found H264_NALU_TYPE_SLC_EXT.");
        currSlice->p_Dec->nalu_ret = SkipNALU;
        break;
    case H264_NALU_TYPE_PREFIX:
        H264D_DBG(H264D_DBG_PARSE_NALU, "Found H264_NALU_TYPE_PREFIX.");
        process_prefix(currSlice);
        break;
    case H264_NALU_TYPE_AUD:
        H264D_DBG(H264D_DBG_PARSE_NALU, "Found H264_NALU_TYPE_AUD.");
        currSlice->p_Dec->nalu_ret = SkipNALU;
        break;
    case H264_NALU_TYPE_EOSEQ:
        H264D_DBG(H264D_DBG_PARSE_NALU, "Found H264_NALU_TYPE_EOSEQ.");
        currSlice->p_Dec->nalu_ret = SkipNALU;
        break;
    case H264_NALU_TYPE_EOSTREAM:
        H264D_DBG(H264D_DBG_PARSE_NALU, "Found H264_NALU_TYPE_EOSTREAM.");
        currSlice->p_Dec->nalu_ret = SkipNALU;
        break;
    case H264_NALU_TYPE_FILL:
        H264D_DBG(H264D_DBG_PARSE_NALU, "Found H264_NALU_TYPE_FILL.");
        currSlice->p_Dec->nalu_ret = SkipNALU;
        break;
    case H264_NALU_TYPE_VDRD:
        H264D_DBG(H264D_DBG_PARSE_NALU, "Found H264_NALU_TYPE_VDRD.");
        currSlice->p_Dec->nalu_ret = SkipNALU;
        break;
    case H264_NALU_TYPE_DPA:
    case H264_NALU_TYPE_DPB:
    case H264_NALU_TYPE_DPC:
        H264D_DBG(H264D_DBG_PARSE_NALU,
                  "Found H264_NALU_TYPE_DPA DPB DPC, and not supported.");
        currSlice->p_Dec->nalu_ret = NaluNotSupport;
        break;
    default:
        currSlice->p_Dec->nalu_ret = SkipNALU;
        break;
    }

    return ret = MPP_OK;
__FAILED:
    H264D_DBG(H264D_DBG_PARSE_NALU, "parser_one_nalu error.");
    currSlice->p_Dec->nalu_ret = ReadNaluError;
    return ret;
}